

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locavailable.cpp
# Opt level: O1

UBool uloc_cleanup(void)

{
  char **buffer;
  
  buffer = _installedLocales;
  if (_installedLocales != (char **)0x0) {
    _installedLocales = (char **)0x0;
    _installedLocalesCount = 0;
    LOCK();
    _installedLocalesInitOnce.fState.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
    UNLOCK();
    uprv_free_63(buffer);
  }
  return '\x01';
}

Assistant:

static UBool U_CALLCONV uloc_cleanup(void) {
    char ** temp;

    if (_installedLocales) {
        temp = _installedLocales;
        _installedLocales = NULL;

        _installedLocalesCount = 0;
        _installedLocalesInitOnce.reset();

        uprv_free(temp);
    }
    return TRUE;
}